

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

LY_ERR moveto_scnode_dfs(lyxp_set *set,lysc_node *start,uint32_t start_idx,lys_module *moveto_mod,
                        char *ncname,uint32_t options)

{
  lyxp_set_node *plVar1;
  lysc_node *plVar2;
  LY_ERR LVar3;
  lysc_node *plVar4;
  long lVar5;
  ulong uVar6;
  lysc_node *node;
  
  if (start == (lysc_node *)0x0) {
    return LY_SUCCESS;
  }
  plVar2 = start;
  do {
    node = plVar2;
    if ((node != start) && ((node->nodetype & 0x82) == 0)) {
      LVar3 = moveto_scnode_check(node,start,set,ncname,moveto_mod);
      if (LVar3 == LY_EINVAL) goto LAB_001af6a0;
      if (LVar3 == LY_SUCCESS) {
        if ((ulong)set->used != 0) {
          lVar5 = 0xc;
          uVar6 = 0;
          do {
            if ((((int)start_idx < 0 || start_idx != uVar6) &&
                (plVar1 = (set->val).nodes, *(lysc_node **)((long)plVar1 + lVar5 + -0xc) == node))
               && (*(int *)((long)plVar1 + lVar5 + -4) == 3)) {
              *(undefined4 *)((long)&plVar1->node + lVar5) = 2;
              if ((uint)uVar6 <= start_idx) goto LAB_001af5e2;
              goto LAB_001af69b;
            }
            uVar6 = uVar6 + 1;
            lVar5 = lVar5 + 0x18;
          } while (set->used != uVar6);
        }
        LVar3 = lyxp_set_scnode_insert_node
                          (set,node,LYXP_NODE_ELEM,LYXP_AXIS_DESCENDANT,(uint32_t *)0x0);
        if (LVar3 != LY_SUCCESS) {
          return LY_EMEM;
        }
      }
    }
LAB_001af5e2:
    plVar4 = lysc_node_child(node);
    if ((plVar4 == (lysc_node *)0x0) ||
       ((plVar2 = plVar4,
        plVar4->nodetype == (uint16_t)((ushort)((options & 0x10) == 0) * 0x1000 + 0x1000) &&
        (plVar2 = plVar4->next, plVar4->next == (lysc_node *)0x0)))) {
LAB_001af69b:
      while( true ) {
        if (node == start) {
          return LY_SUCCESS;
        }
LAB_001af6a0:
        plVar2 = node->next;
        if (node->next != (lysc_node *)0x0) break;
        node = node->parent;
      }
    }
  } while( true );
}

Assistant:

static LY_ERR
moveto_scnode_dfs(struct lyxp_set *set, const struct lysc_node *start, uint32_t start_idx,
        const struct lys_module *moveto_mod, const char *ncname, uint32_t options)
{
    const struct lysc_node *next, *elem;
    uint32_t idx;
    LY_ERR rc;

    /* TREE DFS */
    for (elem = next = start; elem; elem = next) {
        if ((elem == start) || (elem->nodetype & (LYS_CHOICE | LYS_CASE))) {
            /* schema-only nodes, skip root */
            goto next_iter;
        }

        rc = moveto_scnode_check(elem, start, set, ncname, moveto_mod);
        if (!rc) {
            if (lyxp_set_scnode_contains(set, elem, LYXP_NODE_ELEM, start_idx, &idx)) {
                set->val.scnodes[idx].in_ctx = LYXP_SET_SCNODE_ATOM_CTX;
                if (idx > start_idx) {
                    /* we will process it later in the set */
                    goto skip_children;
                }
            } else {
                LY_CHECK_RET(lyxp_set_scnode_insert_node(set, elem, LYXP_NODE_ELEM, LYXP_AXIS_DESCENDANT, NULL));
            }
        } else if (rc == LY_EINVAL) {
            goto skip_children;
        }

next_iter:
        /* TREE DFS NEXT ELEM */
        /* select element for the next run - children first */
        next = lysc_node_child(elem);
        if (next && (next->nodetype == LYS_INPUT) && (options & LYXP_SCNODE_OUTPUT)) {
            next = next->next;
        } else if (next && (next->nodetype == LYS_OUTPUT) && !(options & LYXP_SCNODE_OUTPUT)) {
            next = next->next;
        }
        if (!next) {
skip_children:
            /* no children, so try siblings, but only if it's not the start,
             * that is considered to be the root and it's siblings are not traversed */
            if (elem != start) {
                next = elem->next;
            } else {
                break;
            }
        }
        while (!next) {
            /* no siblings, go back through the parents */
            if (elem->parent == start) {
                /* we are done, no next element to process */
                break;
            }
            /* parent is already processed, go to its sibling */
            elem = elem->parent;
            next = elem->next;
        }
    }

    return LY_SUCCESS;
}